

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O3

void __thiscall PrintAST::visit(PrintAST *this,PointerExpNode *node)

{
  ExpNode *pEVar1;
  TokenNode *pTVar2;
  
  printAST(this,"POINTER_EXP");
  this->level = this->level + 1;
  pEVar1 = node->exp;
  if (pEVar1 != (ExpNode *)0x0) {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
  }
  pTVar2 = node->id;
  if (pTVar2 != (TokenNode *)0x0) {
    (*(pTVar2->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar2,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(PointerExpNode *node) {
    this->printAST("POINTER_EXP");
    up_level();
    if (node->getExp() != nullptr) {
        node->getExp()->accept(this);
    }
    if (node->getId() != nullptr) {
        node->getId()->accept(this);
    }
    down_level();
}